

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::startServerEncryption(TlsCryptographOpenSSL *this)

{
  QSslSocketPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = initSslContext(this);
  if (bVar2) {
    startHandshake(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (**(code **)(*(long *)this + 200))(this);
      return;
    }
  }
  else {
    pQVar1 = this->d;
    QSslSocket::tr((QString *)&local_60,"Unable to init SSL Context: %1",(char *)0x0,-1);
    QTlsBackendOpenSSL::getErrorsFromOpenSsl();
    QString::arg<QString,_true>
              ((QString *)&local_48,(QString *)&local_60,(QString *)&QStack_78,0,(QChar)0x20);
    QTlsPrivate::TlsCryptograph::setErrorAndEmit
              ((QSslSocketPrivate *)this,(SocketError)pQVar1,(QString *)0x14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::startServerEncryption()
{
    if (!initSslContext()) {
        Q_ASSERT(d);
        setErrorAndEmit(d, QAbstractSocket::SslInternalError,
                        QSslSocket::tr("Unable to init SSL Context: %1").arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return;
    }

    // Start connecting. This will place outgoing data in the BIO, so we
    // follow up with calling transmit().
    startHandshake();
    transmit();
}